

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmemory.h
# Opt level: O1

void __thiscall
icu_63::MaybeStackArray<char,_40>::MaybeStackArray
          (MaybeStackArray<char,_40> *this,MaybeStackArray<char,_40> *src)

{
  char *__src;
  
  this->ptr = src->ptr;
  this->capacity = src->capacity;
  this->needToRelease = src->needToRelease;
  __src = src->stackArray;
  if (src->ptr != __src) {
    src->ptr = __src;
    src->capacity = 0x28;
    src->needToRelease = '\0';
    return;
  }
  this->ptr = this->stackArray;
  memcpy(this->stackArray,__src,(long)src->capacity);
  return;
}

Assistant:

icu::MaybeStackArray<T, stackCapacity>::MaybeStackArray(
        MaybeStackArray <T, stackCapacity>&& src) U_NOEXCEPT
        : ptr(src.ptr), capacity(src.capacity), needToRelease(src.needToRelease) {
    if (src.ptr == src.stackArray) {
        ptr = stackArray;
        uprv_memcpy(stackArray, src.stackArray, sizeof(T) * src.capacity);
    } else {
        src.resetToStackArray();  // take ownership away from src
    }
}